

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
ClientBase(ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
           *this,string *host_port,unsigned_short default_port)

{
  ScopeRunner *this_00;
  undefined1 local_48 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  parsed_host_port;
  unsigned_short default_port_local;
  string *host_port_local;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  
  this->_vptr_ClientBase = (_func_int **)&PTR__ClientBase_00468b40;
  parsed_host_port._38_2_ = default_port;
  Config::Config(&this->config);
  std::shared_ptr<asio::io_context>::shared_ptr(&this->io_service);
  this->internal_io_service = false;
  std::__cxx11::string::string((string *)&this->host);
  this->default_port = parsed_host_port._38_2_;
  std::
  unique_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,std::default_delete<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::unique_ptr<std::default_delete<std::pair<std::__cxx11::string,std::__cxx11::string>>,void>
            ((unique_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,std::default_delete<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&this->host_port);
  Mutex::Mutex(&this->connections_mutex);
  std::
  unordered_set<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>,_std::hash<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>_>,_std::equal_to<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>_>,_std::allocator<std::shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::Connection>_>_>
  ::unordered_set(&this->connections);
  this_00 = (ScopeRunner *)operator_new(8);
  ScopeRunner::ScopeRunner(this_00);
  std::shared_ptr<SimpleWeb::ScopeRunner>::shared_ptr<SimpleWeb::ScopeRunner,void>
            (&this->handler_runner,this_00);
  Mutex::Mutex(&this->synchronous_request_mutex);
  this->synchronous_request_called = false;
  parse_host_port((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                   *)local_48,this,host_port,parsed_host_port._38_2_);
  std::__cxx11::string::operator=((string *)&this->host,(string *)local_48);
  this->port = parsed_host_port.first.field_2._8_2_;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
           *)local_48);
  return;
}

Assistant:

ClientBase(const std::string &host_port, unsigned short default_port) noexcept : default_port(default_port), handler_runner(new ScopeRunner()) {
      auto parsed_host_port = parse_host_port(host_port, default_port);
      host = parsed_host_port.first;
      port = parsed_host_port.second;
    }